

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationIterator::getCE32FromPrefix
          (CollationIterator *this,CollationData *d,uint32_t ce32,UErrorCode *errorCode)

{
  UChar UVar1;
  int cp;
  UStringTrieResult UVar2;
  UChar *pUVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  UCharsTrie prefixes;
  UCharsTrie local_48;
  
  pUVar3 = d->contexts + (ce32 >> 0xd);
  local_48.uchars_ = pUVar3 + 2;
  uVar5 = CONCAT22(*pUVar3,pUVar3[1]);
  local_48.ownedArray_ = (char16_t *)0x0;
  local_48.remainingMatchLength_ = -1;
  uVar4 = 0;
  local_48.pos_ = local_48.uchars_;
  do {
    cp = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (cp < 0) break;
    UVar2 = UCharsTrie::nextForCodePoint(&local_48,cp);
    if (1 < (int)UVar2) {
      pUVar3 = local_48.pos_ + 1;
      UVar1 = *local_48.pos_;
      if (UVar1 < L'\0') {
        uVar5 = (ushort)UVar1 & 0x7fff;
        if (0x3fff < uVar5) {
          if (uVar5 == 0x7fff) {
            uVar6 = (uint)(ushort)local_48.pos_[1] << 0x10;
            pUVar3 = local_48.pos_ + 2;
          }
          else {
            uVar6 = uVar5 * 0x10000 + 0xc0000000;
          }
          uVar5 = (ushort)*pUVar3 | uVar6;
        }
      }
      else if ((ushort)UVar1 < 0x4040) {
        uVar5 = ((ushort)UVar1 >> 6) - 1;
      }
      else if ((ushort)UVar1 < 0x7fc0) {
        uVar5 = ((ushort)UVar1 & 0x7fc0) * 0x400 + (uint)(ushort)*pUVar3 + 0xfeff0000;
      }
      else {
        uVar5 = CONCAT22(local_48.pos_[1],local_48.pos_[2]);
      }
    }
    uVar4 = uVar4 + 1;
  } while ((UVar2 & USTRINGTRIE_NO_VALUE) != USTRINGTRIE_NO_MATCH);
  (*(this->super_UObject)._vptr_UObject[0xc])(this,(ulong)uVar4,errorCode);
  UCharsTrie::~UCharsTrie(&local_48);
  return uVar5;
}

Assistant:

uint32_t
CollationIterator::getCE32FromPrefix(const CollationData *d, uint32_t ce32,
                                     UErrorCode &errorCode) {
    const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    p += 2;
    // Number of code points read before the original code point.
    int32_t lookBehind = 0;
    UCharsTrie prefixes(p);
    for(;;) {
        UChar32 c = previousCodePoint(errorCode);
        if(c < 0) { break; }
        ++lookBehind;
        UStringTrieResult match = prefixes.nextForCodePoint(c);
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)prefixes.getValue();
        }
        if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
    }
    forwardNumCodePoints(lookBehind, errorCode);
    return ce32;
}